

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int execute_filter(archive_read *a,rar_filter *filter,rar_virtual_machine *vm,size_t pos)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint64_t uVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  int iVar13;
  long lVar14;
  uint8_t byte;
  byte bVar15;
  char cVar16;
  uint8_t *puVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint8_t uVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  uint32_t uVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  char cVar30;
  char cVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  int local_b4;
  int local_88 [4];
  int local_78 [7];
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  uint uStack_4c;
  byte local_48;
  undefined3 uStack_47;
  uint8_t *local_38;
  
  uVar4 = filter->prog->fingerprint;
  if (uVar4 == 0xd8bc85e701) {
    uVar3 = filter->initialregisters[4];
    if ((ulong)uVar3 < 0x1e001) {
      uVar27 = filter->initialregisters[0];
      local_38 = vm->memory + uVar3;
      puVar11 = vm->memory;
      for (uVar18 = 0; uVar18 != uVar27; uVar18 = uVar18 + 1) {
        local_58 = 0;
        uStack_54 = 0;
        uStack_50 = 0;
        uStack_5c = 0;
        local_78[0] = 0;
        local_78[1] = 0;
        local_78[2] = 0;
        local_78[3] = 0;
        local_78[6] = 0;
        local_b4 = 0;
        local_78[4] = 0;
        cVar5 = '\0';
        cVar30 = '\0';
        cVar16 = '\0';
        cVar31 = '\0';
        uVar6 = 0;
        iVar7 = 0;
        uVar32 = 0;
        uVar28 = 0;
        for (uVar24 = uVar18; uVar24 < uVar3; uVar24 = uVar24 + uVar27) {
          iVar13 = (int)(char)*puVar11;
          iVar29 = (int)cVar16;
          uVar22 = iVar29 - iVar7;
          local_48 = (char)((int)cVar5 * (uVar32 & 0xffff) + uVar28 * 8 + cVar31 * iVar29 +
                            (int)cVar30 * uVar22 >> 3) - *puVar11;
          uVar19 = iVar13 * 8;
          uVar8 = iVar29 + iVar13 * 8;
          uVar9 = uVar19 - (int)(short)uVar22;
          iVar7 = (int)(short)uVar22 + iVar13 * 8;
          iVar20 = -iVar7;
          if (0 < iVar7) {
            iVar20 = iVar7;
          }
          local_78[4] = iVar20 + local_78[4];
          iVar20 = uVar19 - (int)(short)uVar32;
          iVar7 = -iVar20;
          if (0 < iVar20) {
            iVar7 = iVar20;
          }
          local_b4 = iVar7 + local_b4;
          iVar7 = (int)(short)uVar32 + iVar13 * 8;
          iVar20 = -iVar7;
          if (0 < iVar7) {
            iVar20 = iVar7;
          }
          uVar32 = (int)(uVar19 - iVar29) >> 0x1f;
          uVar33 = (int)uVar8 >> 0x1f;
          uVar34 = (int)uVar9 >> 0x1f;
          local_78[0] = ((uVar19 ^ (int)uVar19 >> 0x1f) - ((int)uVar19 >> 0x1f)) + local_78[0];
          local_78[1] = ((uVar19 - iVar29 ^ uVar32) - uVar32) + local_78[1];
          local_78[2] = ((uVar8 ^ uVar33) - uVar33) + local_78[2];
          local_78[3] = ((uVar9 ^ uVar34) - uVar34) + local_78[3];
          local_78[5] = local_b4;
          local_78[6] = iVar20 + local_78[6];
          cVar16 = local_48 - (char)uVar28;
          uStack_47 = 0;
          (vm->memory + uVar3)[uVar24] = local_48;
          uStack_4c = uVar6 + 1;
          if ((uVar6 & 0x1f) == 0) {
            uVar10 = 0;
            for (lVar23 = 5; lVar23 != 0xb; lVar23 = lVar23 + 1) {
              if (local_88[lVar23] < local_78[uVar10]) {
                uVar10 = (ulong)((int)lVar23 - 4U & 0xff);
              }
            }
            local_58 = 0;
            uStack_54 = 0;
            uStack_50 = 0;
            uStack_5c = 0;
            local_78[0] = 0;
            local_78[1] = 0;
            local_78[2] = 0;
            local_78[3] = 0;
            local_78[6] = 0;
            switch((int)uVar10) {
            case 1:
              if (-0x11 < cVar31) {
                cVar31 = cVar31 + -1;
              }
              break;
            case 2:
              if (cVar31 < '\x10') {
                cVar31 = cVar31 + '\x01';
              }
              break;
            case 3:
              if (-0x11 < cVar30) {
                cVar30 = cVar30 + -1;
              }
              break;
            case 4:
              if (cVar30 < '\x10') {
                cVar30 = cVar30 + '\x01';
              }
              break;
            case 5:
              if (-0x11 < cVar5) {
                cVar5 = cVar5 + -1;
              }
              break;
            case 6:
              if (cVar5 < '\x10') {
                cVar5 = cVar5 + '\x01';
              }
            }
            local_b4 = 0;
            local_78[4] = 0;
          }
          puVar11 = puVar11 + 1;
          uVar6 = uVar6 + 1;
          iVar7 = iVar29;
          uVar32 = uVar22;
          uVar28 = (uint)local_48;
        }
      }
      filter->filteredblockaddress = uVar3;
      filter->filteredblocklength = uVar3;
      return 1;
    }
    return 0;
  }
  if (uVar4 == 0x35ad576887) {
    iVar7 = 0;
  }
  else {
    if (uVar4 != 0x393cd7e57e) {
      if (uVar4 == 0x951c2c5dc8) {
        uVar3 = filter->initialregisters[4];
        if (uVar3 < filter->initialregisters[0] || 0x1e000 < uVar3) {
          return 0;
        }
        uVar25 = filter->initialregisters[1];
        puVar17 = vm->memory + uVar3;
        puVar12 = vm->memory;
        lVar23 = (long)puVar17 - (ulong)filter->initialregisters[0];
        puVar11 = puVar17;
        for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
          bVar15 = 0;
          for (lVar14 = 0; (ulong)(lVar26 + lVar14) < (ulong)uVar3; lVar14 = lVar14 + 3) {
            if (puVar17 <= (undefined1 *)(lVar23 + lVar14)) {
              bVar1 = *(byte *)(lVar23 + 3 + lVar14);
              bVar2 = *(byte *)(lVar23 + lVar14);
              uVar18 = (uint)bVar1 - (uint)bVar2;
              uVar27 = -uVar18;
              if (0 < (int)uVar18) {
                uVar27 = uVar18;
              }
              uVar6 = (uint)bVar15 - (uint)bVar2;
              uVar24 = -uVar6;
              if (0 < (int)uVar6) {
                uVar24 = uVar6;
              }
              uVar6 = uVar6 + uVar18;
              uVar18 = -uVar6;
              if (0 < (int)uVar6) {
                uVar18 = uVar6;
              }
              if ((((uVar24 & 0xff) < (uVar27 & 0xff)) || (uVar18 < (uVar27 & 0xff))) &&
                 (bVar15 = bVar2, (uVar24 & 0xff) <= uVar18)) {
                bVar15 = bVar1;
              }
            }
            bVar15 = bVar15 - *puVar12;
            puVar12 = puVar12 + 1;
            puVar11[lVar14] = bVar15;
          }
          puVar11 = puVar11 + 1;
          lVar23 = lVar23 + 1;
        }
        for (; uVar25 < uVar3 - 2; uVar25 = uVar25 + 3) {
          puVar17[uVar25] = puVar17[uVar25] + puVar17[uVar25 + 1];
          puVar17[uVar25 + 2] = puVar17[uVar25 + 2] + puVar17[uVar25 + 1];
        }
        filter->filteredblockaddress = uVar3;
        filter->filteredblocklength = uVar3;
      }
      else {
        if (uVar4 != 0x1d0e06077d) {
          archive_set_error(&a->archive,0x54,"No support for RAR VM program filter");
          return 0;
        }
        uVar3 = filter->initialregisters[4];
        if (0x1e000 < (ulong)uVar3) {
          return 0;
        }
        uVar27 = filter->initialregisters[0];
        puVar11 = vm->memory;
        for (uVar18 = 0; uVar18 != uVar27; uVar18 = uVar18 + 1) {
          uVar21 = '\0';
          for (uVar24 = uVar18; uVar24 < uVar3; uVar24 = uVar24 + uVar27) {
            uVar21 = uVar21 - *puVar11;
            puVar11 = puVar11 + 1;
            vm->memory[(ulong)uVar24 + (ulong)uVar3] = uVar21;
          }
        }
        filter->filteredblockaddress = uVar3;
        filter->filteredblocklength = uVar3;
      }
      return 1;
    }
    iVar7 = 1;
  }
  iVar7 = execute_filter_e8(filter,vm,pos,iVar7);
  return iVar7;
}

Assistant:

static int
execute_filter(struct archive_read *a, struct rar_filter *filter, struct rar_virtual_machine *vm, size_t pos)
{
  if (filter->prog->fingerprint == 0x1D0E06077D)
    return execute_filter_delta(filter, vm);
  if (filter->prog->fingerprint == 0x35AD576887)
    return execute_filter_e8(filter, vm, pos, 0);
  if (filter->prog->fingerprint == 0x393CD7E57E)
    return execute_filter_e8(filter, vm, pos, 1);
  if (filter->prog->fingerprint == 0x951C2C5DC8)
    return execute_filter_rgb(filter, vm);
  if (filter->prog->fingerprint == 0xD8BC85E701)
    return execute_filter_audio(filter, vm);

  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT, "No support for RAR VM program filter");
  return 0;
}